

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImgList<char> * __thiscall cimg_library::CImgList<char>::assign(CImgList<char> *this,uint n)

{
  uint uVar1;
  undefined1 auVar2 [16];
  CImg<char> *this_00;
  unsigned_long uVar3;
  uint *puVar4;
  ulong uVar5;
  ulong uVar6;
  ulong *puVar7;
  CImg<char> *pCVar8;
  ulong uVar9;
  CImg<char> *local_80;
  uint local_24 [3];
  CImgList<char> *pCStack_18;
  uint n_local;
  CImgList<char> *this_local;
  
  local_24[2] = n;
  pCStack_18 = this;
  if (n == 0) {
    this_local = assign(this);
  }
  else {
    if ((this->_allocated_width < n) || (n << 2 < this->_allocated_width)) {
      pCVar8 = this->_data;
      if (pCVar8 != (CImg<char> *)0x0) {
        this_00 = pCVar8 + (long)pCVar8[-1]._data;
        while (pCVar8 != this_00) {
          this_00 = this_00 + -1;
          CImg<char>::~CImg(this_00);
        }
        operator_delete__(&pCVar8[-1]._data);
      }
      local_24[1] = 0x10;
      uVar3 = cimg::nearest_pow2<unsigned_int>(local_24 + 2);
      local_24[0] = (uint)uVar3;
      puVar4 = std::max<unsigned_int>(local_24 + 1,local_24);
      uVar1 = *puVar4;
      this->_allocated_width = uVar1;
      uVar5 = CONCAT44(0,uVar1);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar5;
      uVar6 = SUB168(auVar2 * ZEXT816(0x20),0);
      uVar9 = uVar6 + 8;
      if (SUB168(auVar2 * ZEXT816(0x20),8) != 0 || 0xfffffffffffffff7 < uVar6) {
        uVar9 = 0xffffffffffffffff;
      }
      puVar7 = (ulong *)operator_new__(uVar9);
      *puVar7 = uVar5;
      pCVar8 = (CImg<char> *)(puVar7 + 1);
      if (uVar5 != 0) {
        local_80 = pCVar8;
        do {
          CImg<char>::CImg(local_80);
          local_80 = local_80 + 1;
        } while (local_80 != pCVar8 + uVar5);
      }
      this->_data = pCVar8;
    }
    this->_width = local_24[2];
    this_local = this;
  }
  return this_local;
}

Assistant:

CImgList<T>& assign(const unsigned int n) {
      if (!n) return assign();
      if (_allocated_width<n || _allocated_width>(n<<2)) {
        delete[] _data;
        _data = new CImg<T>[_allocated_width = std::max(16U,(unsigned int)cimg::nearest_pow2(n))];
      }
      _width = n;
      return *this;
    }